

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

size_t lzma_bufcpy(uint8_t *in,size_t *in_pos,size_t in_size,uint8_t *out,size_t *out_pos,
                  size_t out_size)

{
  size_t sVar1;
  size_t sVar2;
  ulong __n;
  
  sVar1 = *in_pos;
  sVar2 = *out_pos;
  __n = out_size - sVar2;
  if (in_size - sVar1 < out_size - sVar2) {
    __n = in_size - sVar1;
  }
  memcpy(out + sVar2,in + sVar1,__n);
  *in_pos = sVar1 + __n;
  *out_pos = sVar2 + __n;
  return __n;
}

Assistant:

extern size_t
lzma_bufcpy(const uint8_t *restrict in, size_t *restrict in_pos,
		size_t in_size, uint8_t *restrict out,
		size_t *restrict out_pos, size_t out_size)
{
	const size_t in_avail = in_size - *in_pos;
	const size_t out_avail = out_size - *out_pos;
	const size_t copy_size = my_min(in_avail, out_avail);

	memcpy(out + *out_pos, in + *in_pos, copy_size);

	*in_pos += copy_size;
	*out_pos += copy_size;

	return copy_size;
}